

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jmespath.hpp
# Opt level: O2

void __thiscall
jsoncons::jmespath::detail::
jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
push_token(jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
           *this,token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                 *tok,static_resources *resources,
          vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
          *output_stack,error_code *ec)

{
  token_kind tVar1;
  unary_operator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  *puVar2;
  jmespath_errc __e;
  long lVar3;
  bool bVar4;
  pointer ptVar5;
  size_t sVar6;
  size_t sVar7;
  expr_base_impl<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  *peVar8;
  const_iterator cVar9;
  token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_> *ptVar10;
  pointer ptVar11;
  assertion_error *this_00;
  json_runtime_error<std::runtime_error,_void> *this_01;
  long lVar12;
  pointer ptVar13;
  token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_> *ptVar14;
  vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>
  *this_02;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  const_iterator cVar16;
  pointer ptVar17;
  __normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>
  __tmp;
  token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_> *ptVar18;
  unsigned_long uVar19;
  optional<unsigned_long> oVar20;
  vector<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::key_tokens,_std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::key_tokens>_>
  key_toks;
  type key;
  allocator<char> local_79;
  vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
  toks;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  anon_union_16_5_62c6233c_for_token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_4
  local_50;
  token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_> *local_38;
  
  switch(tok->type_) {
  case current_node:
  case pipe:
  case key:
  case begin_expression_type:
  case variable:
  case variable_binding:
    break;
  case lparen:
    this_02 = (vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>
               *)&this->operator_stack_;
    goto LAB_002c0606;
  case rparen:
    unwind_rparen(this,output_stack,ec);
    return;
  case begin_multi_select_hash:
    std::
    vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>
    ::
    emplace_back<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>
              ((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>
                *)output_stack,tok);
    key._M_string_length = (long)&key.field_2 + 8;
    key._M_dataplus._M_p._0_4_ = 1;
    key.field_2._M_allocated_capacity = 0;
    key.field_2._M_local_buf[8] = '\0';
    std::
    vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>
    ::
    emplace_back<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>
              ((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>
                *)&this->operator_stack_,
               (token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_> *
               )&key);
    goto LAB_002c0adb;
  case end_multi_select_hash:
    local_38 = tok;
    unwind_rparen(this,output_stack,ec);
    key_toks.
    super__Vector_base<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::key_tokens,_std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::key_tokens>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    key_toks.
    super__Vector_base<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::key_tokens,_std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::key_tokens>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    key_toks.
    super__Vector_base<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::key_tokens,_std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::key_tokens>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ptVar17 = (output_stack->
              super__Vector_base<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    while ((ptVar13 = (output_stack->
                      super__Vector_base<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start, ptVar11 = ptVar17,
           ptVar17 != ptVar13 && (ptVar11 = ptVar13, ptVar17[-1].type_ != begin_multi_select_hash)))
    {
      toks.
      super__Vector_base<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      toks.
      super__Vector_base<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      toks.
      super__Vector_base<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      ptVar11 = ptVar17 + -2;
      lVar3 = 0;
      ptVar13 = ptVar17;
      do {
        lVar12 = lVar3;
        ptVar5 = ptVar11;
        ptVar13 = ptVar13 + -1;
        std::
        vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>
        ::
        emplace_back<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>
                  ((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>
                    *)&toks,ptVar13);
        if (ptVar13 ==
            (output_stack->
            super__Vector_base<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start) {
          if (ptVar5->type_ != key) {
            this_00 = (assertion_error *)__cxa_allocate_exception(0x10);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&key,"assertion \'(*it).is_key()\' failed at  <> :0",&local_79);
            assertion_error::assertion_error(this_00,&key);
            __cxa_throw(this_00,&assertion_error::typeinfo,std::runtime_error::~runtime_error);
          }
          break;
        }
        ptVar11 = ptVar5 + -1;
        lVar3 = lVar12 + 0x38;
      } while (ptVar5->type_ != key);
      std::__cxx11::string::string((string *)&key,(string *)((long)ptVar17 + (-0x68 - lVar12)));
      ptVar17 = (pointer)((long)ptVar17 + (-0xa8 - lVar12));
      if (ptVar5[-1].type_ != separator) {
        ptVar17 = ptVar5;
      }
      if (toks.
          super__Vector_base<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish[-1].type_ != literal) {
        std::
        vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>
        ::emplace_back<jsoncons::jmespath::detail::current_node_arg_t_const&>
                  ((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>
                    *)&toks,(current_node_arg_t *)&current_node_arg);
      }
      std::
      __reverse<__gnu_cxx::__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>*,std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>>>
                (toks.
                 super__Vector_base<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 toks.
                 super__Vector_base<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      std::
      vector<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::key_tokens,std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::key_tokens>>
      ::
      emplace_back<std::__cxx11::string,std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>>
                ((vector<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::key_tokens,std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::key_tokens>>
                  *)&key_toks,&key,&toks);
      std::__cxx11::string::~string((string *)&key);
      std::
      vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
      ::~vector(&toks);
    }
    if (ptVar17 == ptVar11) {
      std::error_code::operator=(ec,unbalanced_braces);
      goto LAB_002c12f0;
    }
    std::
    __reverse<__gnu_cxx::__normal_iterator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::key_tokens*,std::vector<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::key_tokens,std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::key_tokens>>>>
              (key_toks.
               super__Vector_base<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::key_tokens,_std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::key_tokens>_>
               ._M_impl.super__Vector_impl_data._M_start,
               key_toks.
               super__Vector_base<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::key_tokens,_std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::key_tokens>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    std::
    vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
    ::erase(output_stack,ptVar17 + -1,
            (output_stack->
            super__Vector_base<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish);
    ptVar17 = (output_stack->
              super__Vector_base<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    if (((output_stack->
         super__Vector_base<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start == ptVar17) ||
       (bVar4 = token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
                is_projection(ptVar17 + -1), !bVar4)) {
LAB_002c128c:
      multi_select_hash::multi_select_hash((multi_select_hash *)&toks,&key_toks);
      jmespath_evaluator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::
      static_resources::
      create_expression<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::multi_select_hash>
                ((static_resources *)resources,(multi_select_hash *)&toks);
      key._M_string_length = (long)&key.field_2 + 8;
      key._M_dataplus._M_p._0_4_ = 0xd;
      key.field_2._M_allocated_capacity = 0;
      key.field_2._M_local_buf[8] = '\0';
      std::
      vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>
      ::
      emplace_back<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>
                ((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>
                  *)output_stack,
                 (token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                  *)&key);
      token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::~token
                ((token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                  *)&key);
      paVar15 = &local_60;
    }
    else {
      sVar6 = token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
              precedence_level(local_38);
      sVar7 = token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
              precedence_level((output_stack->
                               super__Vector_base<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_finish + -1);
      if (sVar7 <= sVar6) {
        sVar6 = token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
                precedence_level(local_38);
        sVar7 = token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
                precedence_level((output_stack->
                                 super__Vector_base<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish + -1);
        if ((sVar6 != sVar7) ||
           (bVar4 = token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                    ::is_right_associative(local_38), !bVar4)) goto LAB_002c128c;
      }
      puVar2 = (output_stack->
               super__Vector_base<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish[-1].field_2.unary_operator_;
      multi_select_hash::multi_select_hash((multi_select_hash *)&key,&key_toks);
      peVar8 = jmespath_evaluator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
               ::static_resources::
               create_expression<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::multi_select_hash>
                         ((static_resources *)resources,(multi_select_hash *)&key);
      (*puVar2->_vptr_unary_operator[3])(puVar2,peVar8);
      paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)((long)&key.field_2 + 8);
    }
    std::
    vector<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::key_tokens,_std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::key_tokens>_>
    ::~vector((vector<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::key_tokens,_std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::key_tokens>_>
               *)paVar15);
LAB_002c12f0:
    std::
    vector<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::key_tokens,_std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::key_tokens>_>
    ::~vector(&key_toks);
    return;
  case begin_multi_select_list:
    std::
    vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>
    ::
    emplace_back<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>
              ((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>
                *)output_stack,tok);
    key._M_string_length = (long)&key.field_2 + 8;
    key._M_dataplus._M_p._0_4_ = 1;
    key.field_2._M_allocated_capacity = 0;
    key.field_2._M_local_buf[8] = '\0';
    std::
    vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>
    ::
    emplace_back<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>
              ((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>
                *)&this->operator_stack_,
               (token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_> *
               )&key);
    goto LAB_002c0adb;
  case end_multi_select_list:
    unwind_rparen(this,output_stack,ec);
    key_toks.
    super__Vector_base<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::key_tokens,_std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::key_tokens>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    key_toks.
    super__Vector_base<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::key_tokens,_std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::key_tokens>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    key_toks.
    super__Vector_base<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::key_tokens,_std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::key_tokens>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    ptVar18 = (output_stack->
              super__Vector_base<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    while ((ptVar14 = (output_stack->
                      super__Vector_base<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start, ptVar10 = ptVar18,
           ptVar18 != ptVar14 && (ptVar10 = ptVar14, ptVar18[-1].type_ != begin_multi_select_list)))
    {
      key.field_2._M_allocated_capacity = 0;
      key._M_dataplus._M_p = (pointer)0x0;
      key._M_string_length = 0;
      ptVar14 = ptVar18 + -2;
      do {
        ptVar10 = ptVar14;
        ptVar18 = ptVar10 + 1;
        std::
        vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>
        ::
        emplace_back<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>
                  ((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>
                    *)&key,ptVar18);
        tVar1 = ptVar10->type_;
        if ((ptVar18 ==
             (output_stack->
             super__Vector_base<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start) || (tVar1 == separator)) break;
        ptVar14 = ptVar10 + -1;
      } while (tVar1 != begin_multi_select_list);
      if (tVar1 == separator) {
        ptVar18 = ptVar10;
      }
      if (*(int *)(key._M_string_length - 0x38) != 0xc) {
        std::
        vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>
        ::emplace_back<jsoncons::jmespath::detail::current_node_arg_t_const&>
                  ((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>
                    *)&key,(current_node_arg_t *)&current_node_arg);
      }
      std::
      __reverse<__gnu_cxx::__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>*,std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>>>
                (key._M_dataplus._M_p,key._M_string_length);
      std::
      vector<std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>,std::allocator<std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>>>
      ::
      emplace_back<std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>>
                ((vector<std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>,std::allocator<std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>>>
                  *)&key_toks,
                 (vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                  *)&key);
      std::
      vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
      ::~vector((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                 *)&key);
    }
    if (ptVar18 == ptVar10) {
      std::error_code::operator=(ec,unbalanced_braces);
      goto LAB_002c1246;
    }
    std::
    vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
    ::erase(output_stack,ptVar18 + -1,
            (output_stack->
            super__Vector_base<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish);
    std::
    __reverse<__gnu_cxx::__normal_iterator<std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>*,std::vector<std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>,std::allocator<std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>>>>>
              (key_toks.
               super__Vector_base<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::key_tokens,_std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::key_tokens>_>
               ._M_impl.super__Vector_impl_data._M_start,
               key_toks.
               super__Vector_base<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::key_tokens,_std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::key_tokens>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    ptVar17 = (output_stack->
              super__Vector_base<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    if (((output_stack->
         super__Vector_base<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start == ptVar17) ||
       (bVar4 = token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
                is_projection(ptVar17 + -1), !bVar4)) {
LAB_002c11e2:
      multi_select_list::multi_select_list
                ((multi_select_list *)&toks,
                 (vector<std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>,_std::allocator<std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
                  *)&key_toks);
      jmespath_evaluator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::
      static_resources::
      create_expression<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::multi_select_list>
                ((static_resources *)resources,(multi_select_list *)&toks);
      key._M_string_length = (long)&key.field_2 + 8;
      key._M_dataplus._M_p._0_4_ = 0xd;
      key.field_2._M_allocated_capacity = 0;
      key.field_2._M_local_buf[8] = '\0';
      std::
      vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>
      ::
      emplace_back<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>
                ((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>
                  *)output_stack,
                 (token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                  *)&key);
      token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::~token
                ((token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                  *)&key);
      paVar15 = &local_60;
    }
    else {
      sVar6 = token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
              precedence_level(tok);
      sVar7 = token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
              precedence_level((output_stack->
                               super__Vector_base<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_finish + -1);
      if (sVar7 <= sVar6) {
        sVar6 = token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
                precedence_level(tok);
        sVar7 = token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
                precedence_level((output_stack->
                                 super__Vector_base<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish + -1);
        if ((sVar6 != sVar7) ||
           (bVar4 = token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                    ::is_right_associative(tok), !bVar4)) goto LAB_002c11e2;
      }
      puVar2 = (output_stack->
               super__Vector_base<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish[-1].field_2.unary_operator_;
      multi_select_list::multi_select_list
                ((multi_select_list *)&key,
                 (vector<std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>,_std::allocator<std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
                  *)&key_toks);
      peVar8 = jmespath_evaluator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
               ::static_resources::
               create_expression<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::multi_select_list>
                         ((static_resources *)resources,(multi_select_list *)&key);
      (*puVar2->_vptr_unary_operator[3])(puVar2,peVar8);
      paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)((long)&key.field_2 + 8);
    }
    std::
    vector<std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>,_std::allocator<std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
    ::~vector((vector<std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>,_std::allocator<std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
               *)paVar15);
LAB_002c1246:
    std::
    vector<std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>,_std::allocator<std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
    ::~vector((vector<std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>,_std::allocator<std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>_>
               *)&key_toks);
    return;
  case begin_filter:
    std::
    vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>
    ::
    emplace_back<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>
              ((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>
                *)output_stack,tok);
    key._M_string_length = (long)&key.field_2 + 8;
    key._M_dataplus._M_p._0_4_ = 1;
    key.field_2._M_allocated_capacity = 0;
    key.field_2._M_local_buf[8] = '\0';
    std::
    vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>
    ::
    emplace_back<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>
              ((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>
                *)&this->operator_stack_,
               (token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_> *
               )&key);
    goto LAB_002c0adb;
  case end_filter:
    unwind_rparen(this,output_stack,ec);
    key_toks.
    super__Vector_base<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::key_tokens,_std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::key_tokens>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    key_toks.
    super__Vector_base<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::key_tokens,_std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::key_tokens>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    key_toks.
    super__Vector_base<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::key_tokens,_std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::key_tokens>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    cVar16._M_current =
         (output_stack->
         super__Vector_base<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    while( true ) {
      cVar9._M_current = cVar16._M_current + -1;
      ptVar17 = (output_stack->
                super__Vector_base<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      ptVar13 = cVar16._M_current;
      if ((cVar16._M_current == ptVar17) ||
         (ptVar13 = ptVar17, (cVar9._M_current)->type_ == begin_filter)) break;
      std::
      vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>
      ::
      emplace_back<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>
                ((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>
                  *)&key_toks,cVar9._M_current);
      cVar16._M_current = cVar9._M_current;
    }
    if (cVar16._M_current != ptVar13) {
      if (*(int *)&key_toks.
                   super__Vector_base<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::key_tokens,_std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::key_tokens>_>
                   ._M_impl.super__Vector_impl_data._M_finish[-1].key._M_dataplus._M_p != 0xc) {
        std::
        vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>
        ::emplace_back<jsoncons::jmespath::detail::current_node_arg_t_const&>
                  ((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>
                    *)&key_toks,(current_node_arg_t *)&current_node_arg);
      }
      std::
      __reverse<__gnu_cxx::__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>*,std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>>>
                (key_toks.
                 super__Vector_base<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::key_tokens,_std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::key_tokens>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 key_toks.
                 super__Vector_base<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::key_tokens,_std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::key_tokens>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      std::
      vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
      ::erase(output_stack,cVar9,
              (output_stack->
              super__Vector_base<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish);
      ptVar17 = (output_stack->
                super__Vector_base<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish;
      if (((output_stack->
           super__Vector_base<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start == ptVar17) ||
         (bVar4 = token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                  ::is_projection(ptVar17 + -1), !bVar4)) {
LAB_002c1142:
        filter_expression::filter_expression
                  ((filter_expression *)&key,
                   (vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                    *)&key_toks);
        local_50.expression_ =
             jmespath_evaluator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
             ::static_resources::
             create_expression<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::filter_expression>
                       ((static_resources *)resources,(filter_expression *)&key);
        toks.
        super__Vector_base<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)&local_60;
        toks.
        super__Vector_base<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)CONCAT44(toks.
                               super__Vector_base<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start._4_4_,0xd);
        toks.
        super__Vector_base<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_60._M_local_buf[0] = '\0';
        std::
        vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>
        ::
        emplace_back<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>
                  ((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>
                    *)output_stack,
                   (token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                    *)&toks);
        token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::~token
                  ((token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                    *)&toks);
      }
      else {
        sVar6 = token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
                precedence_level(tok);
        sVar7 = token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
                precedence_level((output_stack->
                                 super__Vector_base<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish + -1);
        if (sVar7 <= sVar6) {
          sVar6 = token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                  ::precedence_level(tok);
          sVar7 = token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                  ::precedence_level((output_stack->
                                     super__Vector_base<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_finish + -1);
          if ((sVar6 != sVar7) ||
             (bVar4 = token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                      ::is_right_associative(tok), !bVar4)) goto LAB_002c1142;
        }
        puVar2 = (output_stack->
                 super__Vector_base<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish[-1].field_2.unary_operator_;
        filter_expression::filter_expression
                  ((filter_expression *)&key,
                   (vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                    *)&key_toks);
        peVar8 = jmespath_evaluator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
                 ::static_resources::
                 create_expression<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::filter_expression>
                           ((static_resources *)resources,(filter_expression *)&key);
        (*puVar2->_vptr_unary_operator[3])(puVar2,peVar8);
      }
      filter_expression::~filter_expression((filter_expression *)&key);
      goto LAB_002c11a6;
    }
    __e = unbalanced_braces;
    goto LAB_002c1105;
  case separator:
    unwind_rparen(this,output_stack,ec);
    std::
    vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>
    ::
    emplace_back<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>
              ((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>
                *)output_stack,tok);
    key._M_string_length = (long)&key.field_2 + 8;
    key._M_dataplus._M_p._0_4_ = 1;
    key.field_2._M_allocated_capacity = 0;
    key.field_2._M_local_buf[8] = '\0';
    std::
    vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>
    ::
    emplace_back<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>
              ((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>
                *)&this->operator_stack_,
               (token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_> *
               )&key);
    goto LAB_002c0adb;
  case literal:
    ptVar17 = (output_stack->
              super__Vector_base<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    if (((output_stack->
         super__Vector_base<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start != ptVar17) &&
       (ptVar17[-1].type_ == current_node)) {
      token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::operator=
                (ptVar17 + -1,tok);
      return;
    }
    break;
  case expression:
    ptVar17 = (output_stack->
              super__Vector_base<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    if (((output_stack->
         super__Vector_base<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start != ptVar17) &&
       (bVar4 = token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
                is_projection(ptVar17 + -1), bVar4)) {
      sVar6 = token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
              precedence_level(tok);
      sVar7 = token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
              precedence_level((output_stack->
                               super__Vector_base<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_finish + -1);
      if (sVar6 < sVar7) {
LAB_002c0b67:
        puVar2 = (output_stack->
                 super__Vector_base<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish[-1].field_2.unary_operator_;
        (*puVar2->_vptr_unary_operator[3])(puVar2,(tok->field_2).expression_);
        return;
      }
      sVar6 = token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
              precedence_level(tok);
      sVar7 = token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
              precedence_level((output_stack->
                               super__Vector_base<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_finish + -1);
      if ((sVar6 == sVar7) &&
         (bVar4 = token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                  ::is_right_associative(tok), bVar4)) goto LAB_002c0b67;
    }
    break;
  case binary_operator:
  case unary_operator:
    this_02 = (vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>
               *)&this->operator_stack_;
    ptVar17 = (this->operator_stack_).
              super__Vector_base<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (((this->operator_stack_).
         super__Vector_base<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start == ptVar17) || (ptVar17[-1].type_ == lparen))
    goto LAB_002c0606;
    sVar6 = token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
            precedence_level(tok);
    sVar7 = token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
            precedence_level((this->operator_stack_).
                             super__Vector_base<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish + -1);
    if (sVar6 < sVar7) goto LAB_002c0606;
    sVar6 = token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
            precedence_level(tok);
    sVar7 = token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
            precedence_level((this->operator_stack_).
                             super__Vector_base<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish + -1);
    if ((sVar6 == sVar7) &&
       (bVar4 = token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
                is_right_associative(tok), bVar4)) goto LAB_002c0606;
    cVar16._M_current =
         (this->operator_stack_).
         super__Vector_base<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    while ((ptVar18 = cVar16._M_current + -1,
           cVar16._M_current !=
           (((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
              *)this_02)->
           super__Vector_base<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start &&
           ((ptVar18->type_ & ~lparen) == binary_operator))) {
      sVar6 = token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
              precedence_level(tok);
      sVar7 = token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
              precedence_level(ptVar18);
      if (sVar6 <= sVar7) {
        sVar6 = token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
                precedence_level(tok);
        sVar7 = token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
                precedence_level(ptVar18);
        if ((sVar6 != sVar7) ||
           (bVar4 = token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                    ::is_right_associative(tok), !bVar4)) break;
      }
      std::
      vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>
      ::
      emplace_back<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>
                ((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>
                  *)output_stack,ptVar18);
      cVar16._M_current = ptVar18;
    }
    std::
    vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
    ::erase((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
             *)this_02,cVar16,
            (this->operator_stack_).
            super__Vector_base<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish);
    output_stack = (vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                    *)this_02;
    break;
  case function:
    std::
    vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>
    ::
    emplace_back<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>
              ((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>
                *)output_stack,tok);
    key._M_string_length = (long)&key.field_2 + 8;
    key._M_dataplus._M_p._0_4_ = 1;
    key.field_2._M_allocated_capacity = 0;
    key.field_2._M_local_buf[8] = '\0';
    std::
    vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>
    ::
    emplace_back<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>
              ((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>
                *)&this->operator_stack_,
               (token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_> *
               )&key);
LAB_002c0adb:
    token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::~token
              ((token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_> *
               )&key);
switchD_002c05fe_default:
    return;
  case end_function:
    unwind_rparen(this,output_stack,ec);
    key_toks.
    super__Vector_base<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::key_tokens,_std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::key_tokens>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    key_toks.
    super__Vector_base<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::key_tokens,_std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::key_tokens>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    key_toks.
    super__Vector_base<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::key_tokens,_std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::key_tokens>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    uVar19 = 0;
    cVar16._M_current =
         (output_stack->
         super__Vector_base<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    while( true ) {
      cVar9._M_current = cVar16._M_current + -1;
      ptVar17 = (output_stack->
                super__Vector_base<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      ptVar13 = cVar16._M_current;
      if ((cVar16._M_current == ptVar17) ||
         (ptVar13 = ptVar17, (cVar9._M_current)->type_ == function)) break;
      uVar19 = uVar19 + ((cVar9._M_current)->type_ == argument);
      std::
      vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>
      ::
      emplace_back<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>
                ((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>
                  *)&key_toks,cVar9._M_current);
      cVar16._M_current = cVar9._M_current;
    }
    if (cVar16._M_current == ptVar13) {
      __e = unbalanced_parentheses;
    }
    else {
      oVar20 = token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
               arity(cVar9._M_current);
      if ((((undefined1  [16])
            oVar20.super__Optional_base<unsigned_long,_true,_true>._M_payload.
            super__Optional_payload_base<unsigned_long> & (undefined1  [16])0x1) ==
           (undefined1  [16])0x0) ||
         (oVar20 = token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                   ::arity(cVar9._M_current),
         uVar19 == oVar20.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                   super__Optional_payload_base<unsigned_long>._M_payload)) {
        if (uVar19 == 0) {
          std::
          vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>
          ::
          emplace_back<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>
                    ((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>
                      *)&key_toks,cVar9._M_current);
          std::
          vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
          ::erase(output_stack,cVar9,
                  (output_stack->
                  super__Vector_base<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish);
          function_expression::function_expression
                    ((function_expression *)&toks,
                     (vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                      *)&key_toks);
          jmespath_evaluator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
          ::static_resources::
          create_expression<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::function_expression>
                    ((static_resources *)resources,(function_expression *)&toks);
          key._M_string_length = (long)&key.field_2 + 8;
          key._M_dataplus._M_p._0_4_ = 0xd;
          key.field_2._M_allocated_capacity = 0;
          key.field_2._M_local_buf[8] = '\0';
          std::
          vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>
          ::
          emplace_back<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>
                    ((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>
                      *)output_stack,
                     (token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                      *)&key);
          goto LAB_002c0e00;
        }
        if (*(int *)&key_toks.
                     super__Vector_base<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::key_tokens,_std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::key_tokens>_>
                     ._M_impl.super__Vector_impl_data._M_finish[-1].key._M_dataplus._M_p != 0xc) {
          std::
          vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>
          ::emplace_back<jsoncons::jmespath::detail::current_node_arg_t_const&>
                    ((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>
                      *)&key_toks,(current_node_arg_t *)&current_node_arg);
        }
        std::
        __reverse<__gnu_cxx::__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>*,std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>>>
                  (key_toks.
                   super__Vector_base<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::key_tokens,_std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::key_tokens>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                   key_toks.
                   super__Vector_base<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::key_tokens,_std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::key_tokens>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
        std::
        vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>
        ::
        emplace_back<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>
                  ((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>
                    *)&key_toks,cVar9._M_current);
        std::
        vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
        ::erase(output_stack,cVar9,
                (output_stack->
                super__Vector_base<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish);
        ptVar17 = (output_stack->
                  super__Vector_base<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
        if (((output_stack->
             super__Vector_base<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start == ptVar17) ||
           (bVar4 = token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                    ::is_projection(ptVar17 + -1), !bVar4)) {
LAB_002c1339:
          function_expression::function_expression
                    ((function_expression *)&toks,
                     (vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                      *)&key_toks);
          jmespath_evaluator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
          ::static_resources::
          create_expression<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::function_expression>
                    ((static_resources *)resources,(function_expression *)&toks);
          key._M_string_length = (long)&key.field_2 + 8;
          key._M_dataplus._M_p._0_4_ = 0xd;
          key.field_2._M_allocated_capacity = 0;
          key.field_2._M_local_buf[8] = '\0';
          std::
          vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>
          ::
          emplace_back<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>
                    ((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>
                      *)output_stack,
                     (token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                      *)&key);
          goto LAB_002c0e00;
        }
        sVar6 = token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
                precedence_level(tok);
        sVar7 = token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
                precedence_level((output_stack->
                                 super__Vector_base<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish + -1);
        if (sVar7 <= sVar6) {
          sVar6 = token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                  ::precedence_level(tok);
          sVar7 = token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                  ::precedence_level((output_stack->
                                     super__Vector_base<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_finish + -1);
          if ((sVar6 != sVar7) ||
             (bVar4 = token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                      ::is_right_associative(tok), !bVar4)) goto LAB_002c1339;
        }
        puVar2 = (output_stack->
                 super__Vector_base<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish[-1].field_2.unary_operator_;
        function_expression::function_expression
                  ((function_expression *)&key,
                   (vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                    *)&key_toks);
        peVar8 = jmespath_evaluator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
                 ::static_resources::
                 create_expression<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::function_expression>
                           ((static_resources *)resources,(function_expression *)&key);
        (*puVar2->_vptr_unary_operator[3])(puVar2,peVar8);
        paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)((long)&key.field_2 + 8);
        goto LAB_002c0e12;
      }
      __e = invalid_arity;
    }
LAB_002c1105:
    std::error_code::operator=(ec,__e);
LAB_002c11a6:
    std::
    vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
    ::~vector((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
               *)&key_toks);
    return;
  case argument:
    unwind_rparen(this,output_stack,ec);
    break;
  case end_expression_type:
    key_toks.
    super__Vector_base<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::key_tokens,_std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::key_tokens>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    key_toks.
    super__Vector_base<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::key_tokens,_std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::key_tokens>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    key_toks.
    super__Vector_base<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::key_tokens,_std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::key_tokens>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    cVar16._M_current =
         (output_stack->
         super__Vector_base<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    while( true ) {
      ptVar14 = cVar16._M_current + -1;
      ptVar18 = (output_stack->
                super__Vector_base<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      cVar9._M_current = cVar16._M_current;
      if ((cVar16._M_current == ptVar18) ||
         (cVar9._M_current = ptVar18, ptVar14->type_ == begin_expression_type)) break;
      std::
      vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>
      ::
      emplace_back<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>
                ((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>
                  *)&key_toks,ptVar14);
      cVar16._M_current = ptVar14;
    }
    if (cVar16._M_current == cVar9._M_current) {
      this_01 = (json_runtime_error<std::runtime_error,_void> *)__cxa_allocate_exception(0x18);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&key,"Unbalanced braces",(allocator<char> *)&toks);
      json_runtime_error<std::runtime_error,_void>::json_runtime_error(this_01,&key);
      __cxa_throw(this_01,&json_runtime_error<std::runtime_error,void>::typeinfo,
                  json_runtime_error<std::runtime_error,_void>::~json_runtime_error);
    }
    if (*(int *)&key_toks.
                 super__Vector_base<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::key_tokens,_std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::key_tokens>_>
                 ._M_impl.super__Vector_impl_data._M_finish[-1].key._M_dataplus._M_p != 0xc) {
      std::
      vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>
      ::emplace_back<jsoncons::jmespath::detail::current_node_arg_t_const&>
                ((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>
                  *)&key_toks,(current_node_arg_t *)&current_node_arg);
    }
    std::
    __reverse<__gnu_cxx::__normal_iterator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>*,std::vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>>>
              (key_toks.
               super__Vector_base<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::key_tokens,_std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::key_tokens>_>
               ._M_impl.super__Vector_impl_data._M_start,
               key_toks.
               super__Vector_base<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::key_tokens,_std::allocator<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::key_tokens>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    std::
    vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
    ::erase(output_stack,cVar16,
            (output_stack->
            super__Vector_base<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish);
    function_expression::function_expression
              ((function_expression *)&toks,
               (vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                *)&key_toks);
    jmespath_evaluator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::
    static_resources::
    create_expression<jsoncons::jmespath::detail::jmespath_evaluator<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::function_expression>
              ((static_resources *)resources,(function_expression *)&toks);
    key._M_string_length = (long)&key.field_2 + 8;
    key._M_dataplus._M_p._0_4_ = 0xd;
    key.field_2._M_allocated_capacity = 0;
    key.field_2._M_local_buf[8] = '\0';
    std::
    vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>
    ::
    emplace_back<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>
              ((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>
                *)output_stack,
               (token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_> *
               )&key);
LAB_002c0e00:
    token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::~token
              ((token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_> *
               )&key);
    paVar15 = &local_60;
LAB_002c0e12:
    std::
    vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
    ::~vector((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
               *)paVar15);
    goto LAB_002c11a6;
  case end_of_expression:
    ptVar17 = (this->operator_stack_).
              super__Vector_base<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    while (ptVar17 !=
           (this->operator_stack_).
           super__Vector_base<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start) {
      ptVar17 = ptVar17 + -1;
      std::
      vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>
      ::
      emplace_back<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>
                ((vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>
                  *)output_stack,ptVar17);
    }
    std::
    vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
    ::clear(&this->operator_stack_);
    return;
  default:
    goto switchD_002c05fe_default;
  }
  this_02 = (vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>
             *)output_stack;
LAB_002c0606:
  std::
  vector<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>,std::allocator<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>>
  ::
  emplace_back<jsoncons::jmespath::detail::token<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>>
            (this_02,tok);
  return;
}

Assistant:

void push_token(token<Json>&& tok, static_resources& resources, 
            std::vector<token<Json>>& output_stack, std::error_code& ec)
        {
            switch (tok.type())
            {
                case token_kind::end_filter:
                {
                    unwind_rparen(output_stack, ec);
                    std::vector<token<Json>> toks;
                    auto it = output_stack.rbegin();
                    while (it != output_stack.rend() && (*it).type() != token_kind::begin_filter)
                    {
                        toks.emplace_back(std::move(*it));
                        ++it;
                    }
                    if (it == output_stack.rend())
                    {
                        ec = jmespath_errc::unbalanced_braces;
                        return;
                    }
                    if (toks.back().type() != token_kind::literal)
                    {
                        toks.emplace_back(current_node_arg);
                    }
                    std::reverse(toks.begin(), toks.end());
                    ++it;
                    output_stack.erase(it.base(),output_stack.end());

                    if (!output_stack.empty() && output_stack.back().is_projection() && 
                        (tok.precedence_level() < output_stack.back().precedence_level() ||
                        (tok.precedence_level() == output_stack.back().precedence_level() && tok.is_right_associative())))
                    {
                        output_stack.back().expression_->add_expression(resources.create_expression(filter_expression(std::move(toks))));
                    }
                    else
                    {
                        output_stack.push_back(resources.create_expression(filter_expression(std::move(toks))));
                    }
                    break;
                }
                case token_kind::end_multi_select_list:
                {
                    unwind_rparen(output_stack, ec);
                    std::vector<std::vector<token<Json>>> vals;
                    auto it = output_stack.rbegin();
                    while (it != output_stack.rend() && (*it).type() != token_kind::begin_multi_select_list)
                    {
                        std::vector<token<Json>> toks;
                        do
                        {
                            toks.emplace_back(std::move(*it));
                            ++it;
                        } while (it != output_stack.rend() && (*it).type() != token_kind::begin_multi_select_list && (*it).type() != token_kind::separator);
                        if ((*it).type() == token_kind::separator)
                        {
                            ++it;
                        }
                        if (toks.back().type() != token_kind::literal)
                        {
                            toks.emplace_back(current_node_arg);
                        }
                        std::reverse(toks.begin(), toks.end());
                        vals.emplace_back(std::move(toks));
                    }
                    if (it == output_stack.rend())
                    {
                        ec = jmespath_errc::unbalanced_braces;
                        return;
                    }
                    ++it;
                    output_stack.erase(it.base(),output_stack.end());
                    std::reverse(vals.begin(), vals.end());
                    if (!output_stack.empty() && output_stack.back().is_projection() && 
                        (tok.precedence_level() < output_stack.back().precedence_level() ||
                        (tok.precedence_level() == output_stack.back().precedence_level() && tok.is_right_associative())))
                    {
                        output_stack.back().expression_->add_expression(resources.create_expression(multi_select_list(std::move(vals))));
                    }
                    else
                    {
                        output_stack.push_back(resources.create_expression(multi_select_list(std::move(vals))));
                    }
                    break;
                }
                case token_kind::end_multi_select_hash:
                {
                    unwind_rparen(output_stack, ec);
                    std::vector<key_tokens> key_toks;
                    auto it = output_stack.rbegin();
                    while (it != output_stack.rend() && (*it).type() != token_kind::begin_multi_select_hash)
                    {
                        std::vector<token<Json>> toks;
                        do
                        {
                            toks.emplace_back(std::move(*it));
                            ++it;
                        } while (it != output_stack.rend() && (*it).type() != token_kind::key);
                        JSONCONS_ASSERT((*it).is_key());
                        auto key = std::move((*it).key_);
                        ++it;
                        if ((*it).type() == token_kind::separator)
                        {
                            ++it;
                        }
                        if (toks.back().type() != token_kind::literal)
                        {
                            toks.emplace_back(current_node_arg);
                        }
                        std::reverse(toks.begin(), toks.end());
                        key_toks.emplace_back(std::move(key), std::move(toks));
                    }
                    if (it == output_stack.rend())
                    {
                        ec = jmespath_errc::unbalanced_braces;
                        return;
                    }
                    std::reverse(key_toks.begin(), key_toks.end());
                    ++it;
                    output_stack.erase(it.base(),output_stack.end());

                    if (!output_stack.empty() && output_stack.back().is_projection() && 
                        (tok.precedence_level() < output_stack.back().precedence_level() ||
                        (tok.precedence_level() == output_stack.back().precedence_level() && tok.is_right_associative())))
                    {
                        output_stack.back().expression_->add_expression(resources.create_expression(multi_select_hash(std::move(key_toks))));
                    }
                    else
                    {
                        output_stack.push_back(resources.create_expression(multi_select_hash(std::move(key_toks))));
                    }
                    break;
                }
                case token_kind::end_expression_type:
                {
                    std::vector<token<Json>> toks;
                    auto it = output_stack.rbegin();
                    while (it != output_stack.rend() && (*it).type() != token_kind::begin_expression_type)
                    {
                        toks.emplace_back(std::move(*it));
                        ++it;
                    }
                    if (it == output_stack.rend())
                    {
                        JSONCONS_THROW(json_runtime_error<std::runtime_error>("Unbalanced braces"));
                    }
                    if (toks.back().type() != token_kind::literal)
                    {
                        toks.emplace_back(current_node_arg);
                    }
                    std::reverse(toks.begin(), toks.end());
                    output_stack.erase(it.base(),output_stack.end());
                    output_stack.push_back(resources.create_expression(function_expression(std::move(toks))));
                    break;
                }
                case token_kind::variable:
                    output_stack.push_back(std::move(tok));
                    break;
                case token_kind::variable_binding:
                    output_stack.push_back(std::move(tok));
                    break;
                case token_kind::literal:
                    if (!output_stack.empty() && output_stack.back().type() == token_kind::current_node)
                    {
                        output_stack.back() = std::move(tok);
                    }
                    else
                    {
                        output_stack.push_back(std::move(tok));
                    }
                    break;
                case token_kind::expression:
                    if (!output_stack.empty() && output_stack.back().is_projection() && 
                        (tok.precedence_level() < output_stack.back().precedence_level() ||
                        (tok.precedence_level() == output_stack.back().precedence_level() && tok.is_right_associative())))
                    {
                        output_stack.back().expression_->add_expression(tok.expression_);
                    }
                    else
                    {
                        output_stack.push_back(std::move(tok));
                    }
                    break;
                case token_kind::rparen:
                    {
                        unwind_rparen(output_stack, ec);
                        break;
                    }
                case token_kind::end_function:
                    {
                        unwind_rparen(output_stack, ec);
                        std::vector<token<Json>> toks;
                        auto it = output_stack.rbegin();
                        std::size_t arg_count = 0;
                        while (it != output_stack.rend() && (*it).type() != token_kind::function)
                        {
                            if ((*it).type() == token_kind::argument)
                            {
                                ++arg_count;
                            }
                            toks.emplace_back(std::move(*it));
                            ++it;
                        }
                        if (it == output_stack.rend())
                        {
                            ec = jmespath_errc::unbalanced_parentheses;
                            return;
                        }
                        if ((*it).arity() && arg_count != *((*it).arity()))
                        {
                            ec = jmespath_errc::invalid_arity;
                            return;
                        }
                        if (arg_count == 0)
                        {
                            toks.emplace_back(std::move(*it));
                            ++it;
                            output_stack.erase(it.base(), output_stack.end());
                            output_stack.push_back(resources.create_expression(function_expression(std::move(toks))));
                            break;
                        }
                        if (toks.back().type() != token_kind::literal)
                        {
                            toks.emplace_back(current_node_arg);
                        }
                        std::reverse(toks.begin(), toks.end());
                        toks.push_back(std::move(*it));
                        ++it;
                        output_stack.erase(it.base(),output_stack.end());

                        if (!output_stack.empty() && output_stack.back().is_projection() && 
                            (tok.precedence_level() < output_stack.back().precedence_level() ||
                            (tok.precedence_level() == output_stack.back().precedence_level() && tok.is_right_associative())))
                        {
                            output_stack.back().expression_->add_expression(resources.create_expression(function_expression(std::move(toks))));
                        }
                        else
                        {
                            output_stack.push_back(resources.create_expression(function_expression(std::move(toks))));
                        }
                        break;
                    }
                case token_kind::end_of_expression:
                    {
                        auto it = operator_stack_.rbegin();
                        while (it != operator_stack_.rend())
                        {
                            output_stack.push_back(std::move(*it));
                            ++it;
                        }
                        operator_stack_.clear();
                        break;
                    }
                case token_kind::unary_operator:
                case token_kind::binary_operator:
                {
                    if (operator_stack_.empty() || operator_stack_.back().is_lparen())
                    {
                        operator_stack_.emplace_back(std::move(tok));
                    }
                    else if (tok.precedence_level() < operator_stack_.back().precedence_level()
                             || (tok.precedence_level() == operator_stack_.back().precedence_level() && tok.is_right_associative()))
                    {
                        operator_stack_.emplace_back(std::move(tok));
                    }
                    else
                    {
                        auto it = operator_stack_.rbegin();
                        while (it != operator_stack_.rend() && (*it).is_operator()
                               && (tok.precedence_level() > (*it).precedence_level()
                             || (tok.precedence_level() == (*it).precedence_level() && tok.is_right_associative())))
                        {
                            output_stack.push_back(std::move(*it));
                            ++it;
                        }

                        operator_stack_.erase(it.base(),operator_stack_.end());
                        operator_stack_.emplace_back(std::move(tok));
                    }
                    break;
                }
                case token_kind::separator:
                {
                    unwind_rparen(output_stack, ec);
                    output_stack.push_back(std::move(tok));
                    operator_stack_.emplace_back(token<Json>(lparen_arg));
                    break;
                }
                case token_kind::begin_filter:
                    output_stack.push_back(std::move(tok));
                    operator_stack_.emplace_back(token<Json>(lparen_arg));
                    break;
                case token_kind::begin_multi_select_list:
                    output_stack.push_back(std::move(tok));
                    operator_stack_.emplace_back(token<Json>(lparen_arg));
                    break;
                case token_kind::begin_multi_select_hash:
                    output_stack.push_back(std::move(tok));
                    operator_stack_.emplace_back(token<Json>(lparen_arg));
                    break;
                case token_kind::function:
                    output_stack.push_back(std::move(tok));
                    operator_stack_.emplace_back(token<Json>(lparen_arg));
                    break;
                case token_kind::current_node:
                    output_stack.push_back(std::move(tok));
                    break;
                case token_kind::key:
                case token_kind::pipe:
                case token_kind::begin_expression_type:
                    output_stack.push_back(std::move(tok));
                    break;
                case token_kind::argument:
                    unwind_rparen(output_stack, ec);
                    output_stack.push_back(std::move(tok));
                    break;
                case token_kind::lparen:
                    operator_stack_.emplace_back(std::move(tok));
                    break;
                default:
                    break;
            }
        }